

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

int secp256k1_clz64_var(uint64_t x)

{
  int ret;
  uint64_t x_local;
  undefined4 local_4;
  
  if (x == 0) {
    local_4 = 0x40;
  }
  else {
    ret = 0;
    for (x_local = x; (x_local & 0x8000000000000000) == 0; x_local = x_local << 1) {
      ret = ret + 1;
    }
    local_4 = ret;
  }
  return local_4;
}

Assistant:

SECP256K1_INLINE static int secp256k1_clz64_var(uint64_t x) {
    int ret;
    if (!x) {
        return 64;
    }
# if defined(HAVE_BUILTIN_CLZLL)
    ret = __builtin_clzll(x);
# else
    /*FIXME: debruijn fallback. */
    for (ret = 0; ((x & (1ULL << 63)) == 0); x <<= 1, ret++);
# endif
    return ret;
}